

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

uint __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetMarkCountForSweep
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  ulong *puVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BVIndex BVar5;
  SmallHeapBlockBitVector *pSVar6;
  long lVar7;
  undefined8 *in_FS_OFFSET;
  undefined1 auStack_38 [8];
  SmallHeapBlockBitVector temp;
  
  if (this->freeObjectList != this->lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4c5,"(IsFreeBitsValid())","IsFreeBitsValid()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  auStack_38 = (undefined1  [8])0x0;
  temp.data[0].word = 0;
  js_memcpy_s(auStack_38,0x20,this->markBits,0x20);
  pSVar6 = GetInvalidBitVector(this);
  lVar7 = 0;
  do {
    puVar1 = (ulong *)((long)(temp.data + -1) + lVar7);
    *puVar1 = *puVar1 & ~*(ulong *)((long)&pSVar6->data[0].word + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x20);
  if (this->freeCount != 0) {
    lVar7 = 0;
    do {
      puVar1 = (ulong *)((long)(temp.data + -1) + lVar7);
      *puVar1 = *puVar1 & ~*(ulong *)((long)&(this->freeBits).data[0].word + lVar7);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x20);
  }
  BVar5 = BVStatic<256UL>::Count((BVStatic<256UL> *)auStack_38);
  return BVar5;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountForSweep()
{
    Assert(IsFreeBitsValid());

    // Make a local copy of mark bits, so we don't modify the actual mark bits.
    SmallHeapBlockBitVector temp;
    temp.Copy(this->GetMarkedBitVector());

    // Remove any invalid bits that may have been set
    temp.Minus(this->GetInvalidBitVector());

    // Remove the mark bit for things that are still free
    if (this->freeCount != 0)
    {
        temp.Minus(this->GetFreeBitVector());
    }

    return temp.Count();
}